

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintPrototypeSyntax *syntax)

{
  undefined8 uVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar2;
  reference pTVar3;
  Symbol *pSVar4;
  SyntaxNode *in_RSI;
  Symbol *in_RDI;
  Scope *in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  ClassType *classType;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  ConstraintBlockSymbol *result;
  Token nameToken;
  Compilation *comp;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff08;
  bitmask<slang::ast::ConstraintBlockFlags> *r;
  Symbol *in_stack_ffffffffffffff10;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff18;
  Type *type;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  byte bVar5;
  short in_stack_ffffffffffffff26;
  Compilation *args_2;
  Compilation *specifiers;
  Compilation *in_stack_ffffffffffffff38;
  ConstraintBlockSymbol *scope_00;
  SyntaxNode *in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff50;
  bitmask<slang::ast::ConstraintBlockFlags> local_99;
  ClassType *local_98;
  bitmask<slang::ast::ConstraintBlockFlags> local_8b;
  bitmask<slang::ast::ConstraintBlockFlags> local_8a;
  bitmask<slang::ast::ConstraintBlockFlags> local_89;
  undefined8 local_88;
  Info *pIStack_80;
  Token *local_78;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_70;
  SyntaxNode **local_68;
  bitmask<slang::ast::ConstraintBlockFlags> local_59 [17];
  SourceLocation local_48;
  string_view local_40;
  ConstraintBlockSymbol *local_30;
  Token local_28;
  Compilation *local_18;
  SyntaxNode *local_10;
  Symbol *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = Scope::getCompilation((Scope *)in_RDI);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x3fd5e0);
  local_28 = slang::syntax::SyntaxNode::getLastToken(in_stack_ffffffffffffff40);
  args_2 = local_18;
  specifiers = local_18;
  local_40 = parsing::Token::valueText
                       ((Token *)CONCAT26(in_stack_ffffffffffffff26,
                                          CONCAT15(in_stack_ffffffffffffff25,
                                                   in_stack_ffffffffffffff20)));
  local_48 = parsing::Token::location(&local_28);
  local_30 = BumpAllocator::
             emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       ((BumpAllocator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        (basic_string_view<char,_std::char_traits<char>_> *)specifiers,
                        (SourceLocation *)args_2);
  Symbol::setSyntax(&local_30->super_Symbol,local_10);
  scope_00 = local_30;
  pSVar4 = local_8;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             CONCAT26(in_stack_ffffffffffffff26,
                      CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20)),
             in_stack_ffffffffffffff18);
  syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffff50._M_extent_value;
  syntax_00._M_ptr = in_stack_ffffffffffffff48;
  Symbol::setAttributes(pSVar4,(Scope *)scope_00,syntax_00);
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(local_59,Extern);
  bitmask<slang::ast::ConstraintBlockFlags>::operator|=(&local_30->flags,local_59);
  addSpecifierFlags((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)specifiers,
                    (bitmask<slang::ast::ConstraintBlockFlags> *)args_2);
  local_68 = &local_10[3].parent;
  local_70._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          (in_stack_ffffffffffffff08);
  local_78 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                 in_stack_ffffffffffffff18);
  while (bVar2 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff10,
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff08), ((bVar2 ^ 0xffU) & 1) != 0) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_70);
    uVar1._0_2_ = pTVar3->kind;
    uVar1._2_1_ = pTVar3->field_0x2;
    uVar1._3_1_ = pTVar3->numFlags;
    uVar1._4_4_ = pTVar3->rawLen;
    pIStack_80 = pTVar3->info;
    local_88 = uVar1;
    if ((short)uVar1 == 0xa7) {
      bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_8a,ExplicitExtern);
      bitmask<slang::ast::ConstraintBlockFlags>::operator|=(&local_30->flags,&local_8a);
    }
    else if ((short)uVar1 == 0xf8) {
      bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_8b,Pure);
      bitmask<slang::ast::ConstraintBlockFlags>::operator|=(&local_30->flags,&local_8b);
    }
    else if ((short)uVar1 == 0x11c) {
      bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_89,Static);
      bitmask<slang::ast::ConstraintBlockFlags>::operator|=(&local_30->flags,&local_89);
    }
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_70);
    in_stack_ffffffffffffff26 = (short)uVar1;
  }
  pSVar4 = Scope::asSymbol((Scope *)local_8);
  if (pSVar4->kind == ClassType) {
    Scope::asSymbol((Scope *)local_8);
    local_98 = Symbol::as<slang::ast::ClassType>((Symbol *)0x3fd899);
    type = (Type *)&local_30->flags;
    bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_99,Pure);
    bVar2 = bitmask<slang::ast::ConstraintBlockFlags>::has
                      ((bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_ffffffffffffff10,
                       (bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_ffffffffffffff08);
    bVar5 = 0;
    if (bVar2) {
      bVar5 = local_98->isAbstract ^ 0xff;
    }
    if ((bVar5 & 1) != 0) {
      parsing::Token::range((Token *)specifiers);
      Scope::addDiag(in_stack_00000048,classType._4_4_,(SourceRange)in_stack_00000050);
      in_stack_ffffffffffffff10 = local_8;
    }
    r = &local_30->flags;
    bitmask<slang::ast::ConstraintBlockFlags>::bitmask
              ((bitmask<slang::ast::ConstraintBlockFlags> *)&stack0xffffffffffffff4f,Static);
    bVar2 = bitmask<slang::ast::ConstraintBlockFlags>::has
                      ((bitmask<slang::ast::ConstraintBlockFlags> *)in_stack_ffffffffffffff10,r);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      addThisVar((ConstraintBlockSymbol *)
                 CONCAT26(in_stack_ffffffffffffff26,CONCAT15(bVar5,in_stack_ffffffffffffff20)),type)
      ;
    }
  }
  return local_30;
}

Assistant:

ConstraintBlockSymbol& ConstraintBlockSymbol::fromSyntax(const Scope& scope,
                                                         const ConstraintPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->flags |= ConstraintBlockFlags::Extern;

    addSpecifierFlags(syntax.specifiers, result->flags);

    for (auto qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::StaticKeyword:
                result->flags |= ConstraintBlockFlags::Static;
                break;
            case TokenKind::ExternKeyword:
                result->flags |= ConstraintBlockFlags::ExplicitExtern;
                break;
            case TokenKind::PureKeyword:
                result->flags |= ConstraintBlockFlags::Pure;
                break;
            default:
                break;
        }
    }

    if (scope.asSymbol().kind == SymbolKind::ClassType) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (result->flags.has(ConstraintBlockFlags::Pure) && !classType.isAbstract)
            scope.addDiag(diag::PureConstraintInAbstract, nameToken.range());

        if (!result->flags.has(ConstraintBlockFlags::Static))
            result->addThisVar(classType);
    }

    return *result;
}